

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall mjs::interpreter::impl::hoist(impl *this,scan_result *sr)

{
  pointer pbVar1;
  pointer ppfVar2;
  function_definition *func;
  bool bVar3;
  scope *psVar4;
  pointer ppfVar5;
  pointer id;
  wstring_view local_50;
  gc_heap_ptr_untyped local_40;
  
  id = (sr->
       super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
       ).
       super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
       ._M_head_impl.
       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (sr->
           super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
           ).
           super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
           ._M_head_impl.
           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (id != pbVar1) {
    do {
      psVar4 = (scope *)gc_heap_ptr_untyped::get(&(this->active_scope_).super_gc_heap_ptr_untyped);
      bVar3 = scope::has_property(psVar4,id);
      if (!bVar3) {
        psVar4 = (scope *)gc_heap_ptr_untyped::get(&(this->active_scope_).super_gc_heap_ptr_untyped)
        ;
        local_50._M_str = (id->_M_dataplus)._M_p;
        local_50._M_len = id->_M_string_length;
        string::string((string *)&local_40,this->heap_,&local_50);
        scope::put_local(psVar4,(string *)&local_40,(value *)&value::undefined);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      }
      id = id + 1;
    } while (id != pbVar1);
  }
  ppfVar5 = (sr->
            super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
            ).
            super__Tuple_impl<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
            .
            super__Head_base<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_false>
            ._M_head_impl.
            super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppfVar2 = *(pointer *)
             ((long)&(sr->
                     super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                     ).
                     super__Tuple_impl<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                     .
                     super__Head_base<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
                     ._M_impl.super__Vector_impl_data + 8);
  if (ppfVar5 != ppfVar2) {
    do {
      func = *ppfVar5;
      psVar4 = (scope *)gc_heap_ptr_untyped::get(&(this->active_scope_).super_gc_heap_ptr_untyped);
      scope::put_local_function(psVar4,this,func);
      ppfVar5 = ppfVar5 + 1;
    } while (ppfVar5 != ppfVar2);
  }
  return;
}

Assistant:

void hoist(const hoisting_visitor::scan_result& sr) {
        const auto& [ids, funcs] = sr;
        for (const auto& var_id: ids) {
            if (!active_scope_->has_property(var_id)) {
                active_scope_->put_local(string{heap_, var_id}, value::undefined);
            }
        }
        for (const auto f: funcs) {
            active_scope_->put_local_function(*this, *f);
        }
    }